

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O2

int * Abc_FrameReadMiniAigEquivClasses(Abc_Frame_t *pAbc)

{
  int *piVar1;
  Vec_Int_t *p;
  Gia_Man_t *p_00;
  
  if (pAbc->pGiaMiniAig == (Gia_Man_t *)0x0) {
    puts("GIA derived from MiniAig is not available.");
  }
  if (pAbc->vCopyMiniAig == (Vec_Int_t *)0x0) {
    puts("Mapping of MiniAig nodes is not available.");
  }
  p_00 = pAbc->pGia2;
  if (p_00 == (Gia_Man_t *)0x0) {
    puts("Internal GIA with equivalence classes is not available.");
    p_00 = pAbc->pGia2;
  }
  if (p_00->pReprs == (Gia_Rpr_t *)0x0) {
    puts("Equivalence classes of internal GIA are not available.");
    p_00 = pAbc->pGia2;
  }
  if (p_00->nObjs != pAbc->pGiaMiniAig->nObjs) {
    puts("Internal GIA with equivalence classes is not directly derived from MiniAig.");
    p_00 = pAbc->pGia2;
  }
  p = Gia_ManMapEquivAfterScorr(p_00,pAbc->vCopyMiniAig);
  piVar1 = p->pArray;
  p->nCap = 0;
  p->nSize = 0;
  p->pArray = (int *)0x0;
  Vec_IntFree(p);
  return piVar1;
}

Assistant:

int * Abc_FrameReadMiniAigEquivClasses( Abc_Frame_t * pAbc )
{
    Vec_Int_t * vRes;
    int * pRes;
    if ( pAbc->pGiaMiniAig == NULL )
        printf( "GIA derived from MiniAig is not available.\n" );
    if ( pAbc->vCopyMiniAig == NULL )
        printf( "Mapping of MiniAig nodes is not available.\n" );
    if ( pAbc->pGia2 == NULL )
        printf( "Internal GIA with equivalence classes is not available.\n" );
    if ( pAbc->pGia2->pReprs == NULL )
        printf( "Equivalence classes of internal GIA are not available.\n" );
    if ( Gia_ManObjNum(pAbc->pGia2) != Gia_ManObjNum(pAbc->pGiaMiniAig) )
        printf( "Internal GIA with equivalence classes is not directly derived from MiniAig.\n" );
    // derive the set of equivalent node pairs
    vRes = Gia_ManMapEquivAfterScorr( pAbc->pGia2, pAbc->vCopyMiniAig );
    pRes = Vec_IntReleaseArray( vRes );
    Vec_IntFree( vRes );
    return pRes;
}